

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_key(nk_text_edit *state,nk_keys key,int shift_mod,nk_user_font *font,
                    float row_height)

{
  int iVar1;
  nk_rune nVar2;
  float fVar3;
  float local_12c;
  float local_124;
  undefined1 local_114 [8];
  nk_text_find find_5;
  nk_text_find find_4;
  nk_text_find find_3;
  nk_text_find find_2;
  int n;
  float dx_1;
  float goal_x_1;
  float x_1;
  int sel_1;
  int i_1;
  nk_text_edit_row row_1;
  nk_text_find find_1;
  float dx;
  int start;
  float goal_x;
  float x;
  int sel;
  int i;
  nk_text_edit_row row;
  nk_text_find find;
  float row_height_local;
  nk_user_font *font_local;
  int shift_mod_local;
  nk_keys key_local;
  nk_text_edit *state_local;
  
  font_local._4_4_ = key;
  do {
    switch(font_local._4_4_) {
    case NK_KEY_NONE:
    case NK_KEY_SHIFT:
    case NK_KEY_CTRL:
    case NK_KEY_ENTER:
    case NK_KEY_TAB:
    case NK_KEY_COPY:
    case NK_KEY_CUT:
    case NK_KEY_PASTE:
    case NK_KEY_MAX:
      return;
    case NK_KEY_DEL:
      if (state->mode != '\0') {
        if (state->select_start == state->select_end) {
          if (state->cursor < (state->string).len) {
            nk_textedit_delete(state,state->cursor,1);
          }
        }
        else {
          nk_textedit_delete_selection(state);
        }
        state->has_preferred_x = '\0';
        return;
      }
      return;
    case NK_KEY_BACKSPACE:
      if (state->mode != '\0') {
        if (state->select_start == state->select_end) {
          nk_textedit_clamp(state);
          if (0 < state->cursor) {
            nk_textedit_delete(state,state->cursor + -1,1);
            state->cursor = state->cursor + -1;
          }
        }
        else {
          nk_textedit_delete_selection(state);
        }
        state->has_preferred_x = '\0';
        return;
      }
      return;
    case NK_KEY_UP:
      if (state->single_line == '\0') {
        if (shift_mod == 0) {
          if (state->select_start != state->select_end) {
            nk_textedit_move_to_first(state);
          }
        }
        else {
          nk_textedit_prep_selection_at_cursor(state);
        }
        nk_textedit_clamp(state);
        nk_textedit_find_charpos
                  ((nk_text_find *)&row_1.ymax,state,state->cursor,(uint)state->single_line,font,
                   row_height);
        if ((float)find_1.first_char == find_1.y) {
          return;
        }
        if (state->has_preferred_x == '\0') {
          local_12c = row_1.ymax;
        }
        else {
          local_12c = state->preferred_x;
        }
        state->cursor = find_1.first_char;
        nk_textedit_layout_row((nk_text_edit_row *)&sel_1,state,state->cursor,row_height,font);
        dx_1 = (float)sel_1;
        x_1 = 0.0;
        goto LAB_001637c1;
      }
      font_local._4_4_ = NK_KEY_LEFT;
      break;
    case NK_KEY_DOWN:
      if (state->single_line == '\0') {
        if (shift_mod == 0) {
          if (state->select_start != state->select_end) {
            nk_textedit_move_to_last(state);
          }
        }
        else {
          nk_textedit_prep_selection_at_cursor(state);
        }
        nk_textedit_clamp(state);
        nk_textedit_find_charpos
                  ((nk_text_find *)&row.ymax,state,state->cursor,(uint)state->single_line,font,
                   row_height);
        if (find.height == 0.0) {
          return;
        }
        if (state->has_preferred_x == '\0') {
          local_124 = row.ymax;
        }
        else {
          local_124 = state->preferred_x;
        }
        state->cursor = (int)find.y + (int)find.height;
        nk_textedit_layout_row((nk_text_edit_row *)&sel,state,state->cursor,row_height,font);
        start = sel;
        x = 0.0;
        goto LAB_001635d0;
      }
      font_local._4_4_ = NK_KEY_RIGHT;
      break;
    case NK_KEY_LEFT:
      if (shift_mod == 0) {
        if (state->select_start == state->select_end) {
          if (0 < state->cursor) {
            state->cursor = state->cursor + -1;
          }
        }
        else {
          nk_textedit_move_to_first(state);
        }
        state->has_preferred_x = '\0';
        return;
      }
      nk_textedit_clamp(state);
      nk_textedit_prep_selection_at_cursor(state);
      if (0 < state->select_end) {
        state->select_end = state->select_end + -1;
      }
      state->cursor = state->select_end;
      state->has_preferred_x = '\0';
      return;
    case NK_KEY_RIGHT:
      if (shift_mod == 0) {
        if (state->select_start == state->select_end) {
          state->cursor = state->cursor + 1;
        }
        else {
          nk_textedit_move_to_last(state);
        }
        nk_textedit_clamp(state);
        state->has_preferred_x = '\0';
        return;
      }
      nk_textedit_prep_selection_at_cursor(state);
      state->select_end = state->select_end + 1;
      nk_textedit_clamp(state);
      state->cursor = state->select_end;
      state->has_preferred_x = '\0';
      return;
    case NK_KEY_TEXT_INSERT_MODE:
      if (state->mode == '\0') {
        state->mode = '\x01';
        return;
      }
      return;
    case NK_KEY_TEXT_REPLACE_MODE:
      if (state->mode == '\0') {
        state->mode = '\x02';
        return;
      }
      return;
    case NK_KEY_TEXT_RESET_MODE:
      if ((state->mode != '\x01') && (state->mode != '\x02')) {
        return;
      }
      state->mode = '\0';
      return;
    case NK_KEY_TEXT_LINE_START:
      if (shift_mod == 0) {
        if (((state->string).len != 0) && (state->cursor == (state->string).len)) {
          state->cursor = state->cursor + -1;
        }
        nk_textedit_clamp(state);
        nk_textedit_move_to_first(state);
        nk_textedit_find_charpos
                  ((nk_text_find *)&find_4.length,state,state->cursor,(uint)state->single_line,font,
                   row_height);
        state->cursor = (int)find_3.y;
        state->has_preferred_x = '\0';
        return;
      }
      nk_textedit_clamp(state);
      nk_textedit_prep_selection_at_cursor(state);
      if (((state->string).len != 0) && (state->cursor == (state->string).len)) {
        state->cursor = state->cursor + -1;
      }
      nk_textedit_find_charpos
                ((nk_text_find *)&find_3.length,state,state->cursor,(uint)state->single_line,font,
                 row_height);
      state->select_end = (int)find_2.y;
      state->cursor = (int)find_2.y;
      state->has_preferred_x = '\0';
      return;
    case NK_KEY_TEXT_LINE_END:
      if (shift_mod != 0) {
        nk_textedit_clamp(state);
        nk_textedit_prep_selection_at_cursor(state);
        nk_textedit_find_charpos
                  ((nk_text_find *)&find_5.length,state,state->cursor,(uint)state->single_line,font,
                   row_height);
        state->has_preferred_x = '\0';
        state->cursor = (int)find_4.y + (int)find_4.height;
        if ((0 < (int)find_4.height) &&
           (nVar2 = nk_str_rune_at(&state->string,state->cursor + -1), nVar2 == 10)) {
          state->cursor = state->cursor + -1;
        }
        state->select_end = state->cursor;
        return;
      }
      nk_textedit_clamp(state);
      nk_textedit_move_to_first(state);
      nk_textedit_find_charpos
                ((nk_text_find *)local_114,state,state->cursor,(uint)state->single_line,font,
                 row_height);
      state->has_preferred_x = '\0';
      state->cursor = (int)find_5.y + (int)find_5.height;
      if (0 < (int)find_5.height) {
        nVar2 = nk_str_rune_at(&state->string,state->cursor + -1);
        if (nVar2 == 10) {
          state->cursor = state->cursor + -1;
          return;
        }
        return;
      }
      return;
    case NK_KEY_TEXT_START:
      if (shift_mod == 0) {
        state->select_end = 0;
        state->select_start = 0;
        state->cursor = 0;
        state->has_preferred_x = '\0';
        return;
      }
      nk_textedit_prep_selection_at_cursor(state);
      state->select_end = 0;
      state->cursor = 0;
      state->has_preferred_x = '\0';
      return;
    case NK_KEY_TEXT_END:
      if (shift_mod == 0) {
        state->cursor = (state->string).len;
        state->select_end = 0;
        state->select_start = 0;
        state->has_preferred_x = '\0';
        return;
      }
      nk_textedit_prep_selection_at_cursor(state);
      iVar1 = (state->string).len;
      state->select_end = iVar1;
      state->cursor = iVar1;
      state->has_preferred_x = '\0';
      return;
    case NK_KEY_TEXT_UNDO:
      nk_textedit_undo(state);
      state->has_preferred_x = '\0';
      return;
    case NK_KEY_TEXT_REDO:
      nk_textedit_redo(state);
      state->has_preferred_x = '\0';
      return;
    case NK_KEY_TEXT_SELECT_ALL:
      nk_textedit_select_all(state);
      state->has_preferred_x = '\0';
      return;
    case NK_KEY_TEXT_WORD_LEFT:
      if (shift_mod != 0) {
        if (state->select_start == state->select_end) {
          nk_textedit_prep_selection_at_cursor(state);
        }
        iVar1 = nk_textedit_move_to_word_previous(state);
        state->cursor = iVar1;
        state->select_end = state->cursor;
        nk_textedit_clamp(state);
        return;
      }
      if (state->select_start == state->select_end) {
        iVar1 = nk_textedit_move_to_word_previous(state);
        state->cursor = iVar1;
        nk_textedit_clamp(state);
        return;
      }
      nk_textedit_move_to_first(state);
      return;
    case NK_KEY_TEXT_WORD_RIGHT:
      if (shift_mod != 0) {
        if (state->select_start == state->select_end) {
          nk_textedit_prep_selection_at_cursor(state);
        }
        iVar1 = nk_textedit_move_to_word_next(state);
        state->cursor = iVar1;
        state->select_end = state->cursor;
        nk_textedit_clamp(state);
        return;
      }
      if (state->select_start == state->select_end) {
        iVar1 = nk_textedit_move_to_word_next(state);
        state->cursor = iVar1;
        nk_textedit_clamp(state);
        return;
      }
      nk_textedit_move_to_last(state);
      return;
    default:
      return;
    }
  } while( true );
LAB_001635d0:
  if ((int)row.ymin <= (int)x || (float)i <= (float)start) {
LAB_00163657:
    nk_textedit_clamp(state);
    state->has_preferred_x = '\x01';
    state->preferred_x = local_124;
    if (shift_mod != 0) {
      state->select_end = state->cursor;
      return;
    }
    return;
  }
  fVar3 = nk_textedit_get_width(state,(int)find.y + (int)find.height,(int)x,font);
  start = (int)(fVar3 + (float)start);
  if (local_124 < (float)start) goto LAB_00163657;
  state->cursor = state->cursor + 1;
  x = (float)((int)x + 1);
  goto LAB_001635d0;
LAB_001637c1:
  if ((int)row_1.ymin <= (int)x_1 || (float)i_1 <= dx_1) {
LAB_0016386c:
    nk_textedit_clamp(state);
    state->has_preferred_x = '\x01';
    state->preferred_x = local_12c;
    if (shift_mod != 0) {
      state->select_end = state->cursor;
    }
    return;
  }
  fVar3 = nk_textedit_get_width(state,find_1.first_char,(int)x_1,font);
  dx_1 = fVar3 + dx_1;
  if (local_12c < dx_1) goto LAB_0016386c;
  state->cursor = state->cursor + 1;
  x_1 = (float)((int)x_1 + 1);
  goto LAB_001637c1;
}

Assistant:

NK_LIB void
nk_textedit_key(struct nk_text_edit *state, enum nk_keys key, int shift_mod,
    const struct nk_user_font *font, float row_height)
{
retry:
    switch (key)
    {
    case NK_KEY_NONE:
    case NK_KEY_CTRL:
    case NK_KEY_ENTER:
    case NK_KEY_SHIFT:
    case NK_KEY_TAB:
    case NK_KEY_COPY:
    case NK_KEY_CUT:
    case NK_KEY_PASTE:
    case NK_KEY_MAX:
    default: break;
    case NK_KEY_TEXT_UNDO:
         nk_textedit_undo(state);
         state->has_preferred_x = 0;
         break;

    case NK_KEY_TEXT_REDO:
        nk_textedit_redo(state);
        state->has_preferred_x = 0;
        break;

    case NK_KEY_TEXT_SELECT_ALL:
        nk_textedit_select_all(state);
        state->has_preferred_x = 0;
        break;

    case NK_KEY_TEXT_INSERT_MODE:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            state->mode = NK_TEXT_EDIT_MODE_INSERT;
        break;
    case NK_KEY_TEXT_REPLACE_MODE:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            state->mode = NK_TEXT_EDIT_MODE_REPLACE;
        break;
    case NK_KEY_TEXT_RESET_MODE:
        if (state->mode == NK_TEXT_EDIT_MODE_INSERT ||
            state->mode == NK_TEXT_EDIT_MODE_REPLACE)
            state->mode = NK_TEXT_EDIT_MODE_VIEW;
        break;

    case NK_KEY_LEFT:
        if (shift_mod) {
            nk_textedit_clamp(state);
            nk_textedit_prep_selection_at_cursor(state);
            /* move selection left */
            if (state->select_end > 0)
                --state->select_end;
            state->cursor = state->select_end;
            state->has_preferred_x = 0;
        } else {
            /* if currently there's a selection,
             * move cursor to start of selection */
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_first(state);
            else if (state->cursor > 0)
               --state->cursor;
            state->has_preferred_x = 0;
        } break;

    case NK_KEY_RIGHT:
        if (shift_mod) {
            nk_textedit_prep_selection_at_cursor(state);
            /* move selection right */
            ++state->select_end;
            nk_textedit_clamp(state);
            state->cursor = state->select_end;
            state->has_preferred_x = 0;
        } else {
            /* if currently there's a selection,
             * move cursor to end of selection */
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_last(state);
            else ++state->cursor;
            nk_textedit_clamp(state);
            state->has_preferred_x = 0;
        } break;

    case NK_KEY_TEXT_WORD_LEFT:
        if (shift_mod) {
            if( !NK_TEXT_HAS_SELECTION( state ) )
            nk_textedit_prep_selection_at_cursor(state);
            state->cursor = nk_textedit_move_to_word_previous(state);
            state->select_end = state->cursor;
            nk_textedit_clamp(state );
        } else {
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_first(state);
            else {
                state->cursor = nk_textedit_move_to_word_previous(state);
                nk_textedit_clamp(state );
            }
        } break;

    case NK_KEY_TEXT_WORD_RIGHT:
        if (shift_mod) {
            if( !NK_TEXT_HAS_SELECTION( state ) )
                nk_textedit_prep_selection_at_cursor(state);
            state->cursor = nk_textedit_move_to_word_next(state);
            state->select_end = state->cursor;
            nk_textedit_clamp(state);
        } else {
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_last(state);
            else {
                state->cursor = nk_textedit_move_to_word_next(state);
                nk_textedit_clamp(state );
            }
        } break;

    case NK_KEY_DOWN: {
        struct nk_text_find find;
        struct nk_text_edit_row row;
        int i, sel = shift_mod;

        if (state->single_line) {
            /* on windows, up&down in single-line behave like left&right */
            key = NK_KEY_RIGHT;
            goto retry;
        }

        if (sel)
            nk_textedit_prep_selection_at_cursor(state);
        else if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_move_to_last(state);

        /* compute current position of cursor point */
        nk_textedit_clamp(state);
        nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
            font, row_height);

        /* now find character position down a row */
        if (find.length)
        {
            float x;
            float goal_x = state->has_preferred_x ? state->preferred_x : find.x;
            int start = find.first_char + find.length;

            state->cursor = start;
            nk_textedit_layout_row(&row, state, state->cursor, row_height, font);
            x = row.x0;

            for (i=0; i < row.num_chars && x < row.x1; ++i) {
                float dx = nk_textedit_get_width(state, start, i, font);
                x += dx;
                if (x > goal_x)
                    break;
                ++state->cursor;
            }
            nk_textedit_clamp(state);

            state->has_preferred_x = 1;
            state->preferred_x = goal_x;
            if (sel)
                state->select_end = state->cursor;
        }
    } break;

    case NK_KEY_UP: {
        struct nk_text_find find;
        struct nk_text_edit_row row;
        int i, sel = shift_mod;

        if (state->single_line) {
            /* on windows, up&down become left&right */
            key = NK_KEY_LEFT;
            goto retry;
        }

        if (sel)
            nk_textedit_prep_selection_at_cursor(state);
        else if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_move_to_first(state);

         /* compute current position of cursor point */
         nk_textedit_clamp(state);
         nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);

         /* can only go up if there's a previous row */
         if (find.prev_first != find.first_char) {
            /* now find character position up a row */
            float x;
            float goal_x = state->has_preferred_x ? state->preferred_x : find.x;

            state->cursor = find.prev_first;
            nk_textedit_layout_row(&row, state, state->cursor, row_height, font);
            x = row.x0;

            for (i=0; i < row.num_chars && x < row.x1; ++i) {
                float dx = nk_textedit_get_width(state, find.prev_first, i, font);
                x += dx;
                if (x > goal_x)
                    break;
                ++state->cursor;
            }
            nk_textedit_clamp(state);

            state->has_preferred_x = 1;
            state->preferred_x = goal_x;
            if (sel) state->select_end = state->cursor;
         }
      } break;

    case NK_KEY_DEL:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            break;
        if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_delete_selection(state);
        else {
            int n = state->string.len;
            if (state->cursor < n)
                nk_textedit_delete(state, state->cursor, 1);
         }
         state->has_preferred_x = 0;
         break;

    case NK_KEY_BACKSPACE:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            break;
        if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_delete_selection(state);
        else {
            nk_textedit_clamp(state);
            if (state->cursor > 0) {
                nk_textedit_delete(state, state->cursor-1, 1);
                --state->cursor;
            }
         }
         state->has_preferred_x = 0;
         break;

    case NK_KEY_TEXT_START:
         if (shift_mod) {
            nk_textedit_prep_selection_at_cursor(state);
            state->cursor = state->select_end = 0;
            state->has_preferred_x = 0;
         } else {
            state->cursor = state->select_start = state->select_end = 0;
            state->has_preferred_x = 0;
         }
         break;

    case NK_KEY_TEXT_END:
         if (shift_mod) {
            nk_textedit_prep_selection_at_cursor(state);
            state->cursor = state->select_end = state->string.len;
            state->has_preferred_x = 0;
         } else {
            state->cursor = state->string.len;
            state->select_start = state->select_end = 0;
            state->has_preferred_x = 0;
         }
         break;

    case NK_KEY_TEXT_LINE_START: {
        if (shift_mod) {
            struct nk_text_find find;
           nk_textedit_clamp(state);
            nk_textedit_prep_selection_at_cursor(state);
            if (state->string.len && state->cursor == state->string.len)
                --state->cursor;
            nk_textedit_find_charpos(&find, state,state->cursor, state->single_line,
                font, row_height);
            state->cursor = state->select_end = find.first_char;
            state->has_preferred_x = 0;
        } else {
            struct nk_text_find find;
            if (state->string.len && state->cursor == state->string.len)
                --state->cursor;
            nk_textedit_clamp(state);
            nk_textedit_move_to_first(state);
            nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);
            state->cursor = find.first_char;
            state->has_preferred_x = 0;
        }
      } break;

    case NK_KEY_TEXT_LINE_END: {
        if (shift_mod) {
            struct nk_text_find find;
            nk_textedit_clamp(state);
            nk_textedit_prep_selection_at_cursor(state);
            nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);
            state->has_preferred_x = 0;
            state->cursor = find.first_char + find.length;
            if (find.length > 0 && nk_str_rune_at(&state->string, state->cursor-1) == '\n')
                --state->cursor;
            state->select_end = state->cursor;
        } else {
            struct nk_text_find find;
            nk_textedit_clamp(state);
            nk_textedit_move_to_first(state);
            nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);

            state->has_preferred_x = 0;
            state->cursor = find.first_char + find.length;
            if (find.length > 0 && nk_str_rune_at(&state->string, state->cursor-1) == '\n')
                --state->cursor;
        }} break;
    }
}